

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meta_pipeline.cpp
# Opt level: O1

MetaPipeline * __thiscall duckdb::MetaPipeline::GetLastChild(MetaPipeline *this)

{
  const_reference pvVar1;
  MetaPipeline *pMVar2;
  type pMVar3;
  vector<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_true> *this_00;
  
  if ((this->children).
      super_vector<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
      .
      super__Vector_base<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->children).
      super_vector<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
      .
      super__Vector_base<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    while( true ) {
      this_00 = &this->children;
      pvVar1 = vector<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_true>::back(this_00);
      pMVar2 = shared_ptr<duckdb::MetaPipeline,_true>::operator->(pvVar1);
      if ((pMVar2->children).
          super_vector<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
          .
          super__Vector_base<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (pMVar2->children).
          super_vector<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
          .
          super__Vector_base<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) break;
      pvVar1 = vector<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_true>::back(this_00);
      this = shared_ptr<duckdb::MetaPipeline,_true>::operator->(pvVar1);
    }
    pvVar1 = vector<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_true>::back(this_00);
    pMVar3 = shared_ptr<duckdb::MetaPipeline,_true>::operator*(pvVar1);
    return pMVar3;
  }
  return this;
}

Assistant:

MetaPipeline &MetaPipeline::GetLastChild() {
	if (children.empty()) {
		return *this;
	}
	reference<const vector<shared_ptr<MetaPipeline>>> current_children = children;
	while (!current_children.get().back()->children.empty()) {
		current_children = current_children.get().back()->children;
	}
	return *current_children.get().back();
}